

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

RACell * __thiscall asmjit::RAPass::_newVarCell(RAPass *this,VirtReg *vreg)

{
  uint *puVar1;
  RAPass *in_RSI;
  long in_RDI;
  uint32_t size;
  RACell *cell;
  size_t remainingBytes;
  uint8_t *ptr;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  ulong *message;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t uVar2;
  undefined8 in_stack_ffffffffffffff90;
  RACell *local_10;
  
  if ((in_RSI->_heap)._slots[0] != (Slot *)0x0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  uVar2 = *(uint32_t *)&(in_RSI->super_CBPass)._name;
  if ((*(byte *)((long)&(in_RSI->super_CBPass)._name + 7) >> 1 & 1) == 0) {
    message = *(ulong **)(in_RDI + 0x18);
    local_10 = (RACell *)*message;
    if (message[1] - (long)local_10 < 0x18) {
      local_10 = (RACell *)Zone::_alloc((Zone *)in_RSI,(size_t)in_RSI);
    }
    else {
      *message = *message + 0x18;
      if (message[1] < *message) {
        DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
      }
    }
    if (local_10 == (RACell *)0x0) {
      CodeEmitter::setLastError
                ((CodeEmitter *)CONCAT44(uVar2,in_stack_ffffffffffffff88),
                 (Error)((ulong)in_RDI >> 0x20),(char *)message);
      return (RACell *)0x0;
    }
    local_10->next = *(RACell **)(in_RDI + 0xe0);
    local_10->offset = 0;
    local_10->size = uVar2;
    local_10->alignment = uVar2;
    *(RACell **)(in_RDI + 0xe0) = local_10;
    puVar1 = std::max<unsigned_int>((uint *)(in_RDI + 0x110),(uint *)&stack0xffffffffffffff8c);
    *(uint *)(in_RDI + 0x110) = *puVar1;
    *(uint32_t *)(in_RDI + 0x114) = *(int *)(in_RDI + 0x114) + uVar2;
    switch(uVar2) {
    case 1:
      *(int *)(in_RDI + 0xf0) = *(int *)(in_RDI + 0xf0) + 1;
      break;
    case 2:
      *(int *)(in_RDI + 0xf4) = *(int *)(in_RDI + 0xf4) + 1;
      break;
    default:
      DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
    case 4:
      *(int *)(in_RDI + 0xf8) = *(int *)(in_RDI + 0xf8) + 1;
      break;
    case 8:
      *(int *)(in_RDI + 0xfc) = *(int *)(in_RDI + 0xfc) + 1;
      break;
    case 0x10:
      *(int *)(in_RDI + 0x100) = *(int *)(in_RDI + 0x100) + 1;
      break;
    case 0x20:
      *(int *)(in_RDI + 0x104) = *(int *)(in_RDI + 0x104) + 1;
      break;
    case 0x40:
      *(int *)(in_RDI + 0x108) = *(int *)(in_RDI + 0x108) + 1;
    }
  }
  else {
    local_10 = _newStackCell(in_RSI,(uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                             (uint32_t)in_stack_ffffffffffffff90);
    if (local_10 == (RACell *)0x0) {
      return (RACell *)0x0;
    }
  }
  (in_RSI->_heap)._slots[0] = (Slot *)local_10;
  return local_10;
}

Assistant:

RACell* RAPass::_newVarCell(VirtReg* vreg) {
  ASMJIT_ASSERT(vreg->_memCell == nullptr);

  RACell* cell;
  uint32_t size = vreg->getSize();

  if (vreg->isStack()) {
    cell = _newStackCell(size, vreg->getAlignment());
    if (ASMJIT_UNLIKELY(!cell)) return nullptr;
  }
  else {
    cell = static_cast<RACell*>(_zone->alloc(sizeof(RACell)));
    if (!cell) goto _NoMemory;

    cell->next = _memVarCells;
    cell->offset = 0;
    cell->size = size;
    cell->alignment = size;

    _memVarCells = cell;
    _memMaxAlign = std::max<uint32_t>(_memMaxAlign, size);
    _memVarTotal += size;

    switch (size) {
      case  1: _mem1ByteVarsUsed++ ; break;
      case  2: _mem2ByteVarsUsed++ ; break;
      case  4: _mem4ByteVarsUsed++ ; break;
      case  8: _mem8ByteVarsUsed++ ; break;
      case 16: _mem16ByteVarsUsed++; break;
      case 32: _mem32ByteVarsUsed++; break;
      case 64: _mem64ByteVarsUsed++; break;

      default:
        ASMJIT_NOT_REACHED();
    }
  }

  vreg->_memCell = cell;
  return cell;

_NoMemory:
  cc()->setLastError(DebugUtils::errored(kErrorNoHeapMemory));
  return nullptr;
}